

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status kwssys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  int iVar1;
  __mode_t __mask;
  Status SVar2;
  stat st;
  stat local_b0;
  
  SVar2.Kind_ = POSIX;
  SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x2;
  if (file->_M_string_length != 0) {
    iVar1 = lstat((file->_M_dataplus)._M_p,&local_b0);
    if (iVar1 == 0) {
      if (honor_umask) {
        __mask = umask(0);
        umask(__mask);
        mode = mode & ~__mask;
      }
      iVar1 = chmod((file->_M_dataplus)._M_p,mode);
      if (iVar1 < 0) {
        SVar2 = Status::POSIX_errno();
        return SVar2;
      }
      SVar2.Kind_ = Success;
      SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
  }
  return SVar2;
}

Assistant:

Status SystemTools::SetPermissions(std::string const& file, mode_t mode,
                                   bool honor_umask)
{
  if (!SystemTools::PathExists(file)) {
    return Status::POSIX(ENOENT);
  }
  if (honor_umask) {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
  }
#ifdef _WIN32
  if (_wchmod(Encoding::ToWindowsExtendedPath(file).c_str(), mode) < 0)
#else
  if (chmod(file.c_str(), mode) < 0)
#endif
  {
    return Status::POSIX_errno();
  }

  return Status::Success();
}